

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_coroutine_status(lua_State *L)

{
  TValue *pTVar1;
  lua_State *plVar2;
  char *str;
  
  pTVar1 = L->base;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff9)) {
    plVar2 = (lua_State *)(ulong)(pTVar1->u32).lo;
    if (plVar2 == L) {
      str = anon_var_dwarf_275af + 0x3b;
    }
    else if (plVar2->status == '\0') {
      if ((TValue *)((ulong)(plVar2->stack).ptr32 + 8) < plVar2->base) {
        str = "normal";
      }
      else {
        str = "suspended";
        if (plVar2->top == plVar2->base) {
          str = "dead";
        }
      }
    }
    else if (plVar2->status == '\x01') {
      str = "suspended";
    }
    else {
      str = "dead";
    }
    lua_pushstring(L,str);
    return 1;
  }
  lj_err_arg(L,1,LJ_ERR_NOCORO);
}

Assistant:

LJLIB_CF(coroutine_status)
{
  const char *s;
  lua_State *co;
  if (!(L->top > L->base && tvisthread(L->base)))
    lj_err_arg(L, 1, LJ_ERR_NOCORO);
  co = threadV(L->base);
  if (co == L) s = "running";
  else if (co->status == LUA_YIELD) s = "suspended";
  else if (co->status != LUA_OK) s = "dead";
  else if (co->base > tvref(co->stack)+1+LJ_FR2) s = "normal";
  else if (co->top == co->base) s = "dead";
  else s = "suspended";
  lua_pushstring(L, s);
  return 1;
}